

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderApiTests.cpp
# Opt level: O0

void __thiscall deqp::gles3::Functional::ProgramStateCase::test(ProgramStateCase *this)

{
  size_t *this_00;
  bool bVar1;
  TestLog *log_00;
  RenderContext *context;
  ProgramInfo *pPVar2;
  MessageBuilder *this_01;
  TestLog *siglen;
  uchar *in_R8;
  size_t in_R9;
  MessageBuilder local_278;
  undefined1 local_f8 [8];
  ProgramInfo programInfo;
  Program program;
  undefined1 local_78 [8];
  ShaderAllocator shaders;
  ConstantShaderGenerator sourceGen;
  RenderContext *renderCtx;
  TestLog *log;
  ProgramStateCase *this_local;
  
  log_00 = tcu::TestContext::getLog
                     ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx);
  siglen = log_00;
  context = gles3::Context::getRenderContext((this->super_ApiCase).super_TestCase.m_context);
  this_00 = &shaders.m_shaders._M_t._M_impl.super__Rb_tree_header._M_node_count;
  Functional::anon_unknown_0::ConstantShaderGenerator::ConstantShaderGenerator
            ((ConstantShaderGenerator *)this_00,&this->m_rnd);
  Functional::anon_unknown_0::ShaderAllocator::ShaderAllocator
            ((ShaderAllocator *)local_78,context,(SourceGenerator *)this_00);
  glu::Program::Program((Program *)&programInfo.linkTimeUs,context);
  buildProgram(this,(Program *)&programInfo.linkTimeUs,(ShaderAllocator *)local_78);
  bVar1 = glu::Program::getLinkStatus((Program *)&programInfo.linkTimeUs);
  if (bVar1) {
    pPVar2 = glu::Program::getInfo((Program *)&programInfo.linkTimeUs);
    glu::ProgramInfo::ProgramInfo((ProgramInfo *)local_f8,pPVar2);
    (*(this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[6])
              (this,&programInfo.linkTimeUs,local_78);
    verify(this,(EVP_PKEY_CTX *)&programInfo.linkTimeUs,local_f8,(size_t)siglen,in_R8,in_R9);
    Functional::anon_unknown_0::logProgram
              (log_00,context,(Program *)&programInfo.linkTimeUs,(ShaderAllocator *)local_78);
    glu::ProgramInfo::~ProgramInfo((ProgramInfo *)local_f8);
  }
  else {
    tcu::TestLog::operator<<(&local_278,log_00,(BeginMessageToken *)&tcu::TestLog::Message);
    this_01 = tcu::MessageBuilder::operator<<
                        (&local_278,(char (*) [29])"Fail, couldn\'t link program.");
    tcu::MessageBuilder::operator<<(this_01,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_278);
    tcu::TestContext::setTestResult
              ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_FAIL,"Linking failed");
  }
  glu::Program::~Program((Program *)&programInfo.linkTimeUs);
  Functional::anon_unknown_0::ShaderAllocator::~ShaderAllocator((ShaderAllocator *)local_78);
  Functional::anon_unknown_0::ConstantShaderGenerator::~ConstantShaderGenerator
            ((ConstantShaderGenerator *)
             &shaders.m_shaders._M_t._M_impl.super__Rb_tree_header._M_node_count);
  return;
}

Assistant:

void ProgramStateCase::test (void)
{
	TestLog&				log			= m_testCtx.getLog();
	glu::RenderContext&		renderCtx	= m_context.getRenderContext();

	ConstantShaderGenerator	sourceGen	(m_rnd);

	ShaderAllocator			shaders		(renderCtx, sourceGen);
	glu::Program			program		(renderCtx);

	buildProgram(program, shaders);

	if (program.getLinkStatus())
	{
		glu::ProgramInfo programInfo = program.getInfo();

		executeForProgram(program, shaders);

		verify(program, programInfo);

		logProgram(log, renderCtx, program, shaders);
	}
	else
	{
		log << TestLog::Message << "Fail, couldn't link program." << TestLog::EndMessage;
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Linking failed");
	}
}